

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Vdbe * sqlite3VdbeCreate(sqlite3 *db)

{
  Vdbe *pVVar1;
  Vdbe *__s;
  
  __s = (Vdbe *)sqlite3DbMallocRaw(db,0x110);
  if (__s == (Vdbe *)0x0) {
    __s = (Vdbe *)0x0;
  }
  else {
    memset(__s,0,0x110);
    __s->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->pPrev = __s;
    }
    __s->pNext = pVVar1;
    __s->pPrev = (Vdbe *)0x0;
    db->pVdbe = __s;
    __s->magic = 0x26bceaa5;
  }
  return __s;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(sqlite3 *db){
  Vdbe *p;
  p = sqlite3DbMallocZero(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->pPrev = p;
  }
  p->pNext = db->pVdbe;
  p->pPrev = 0;
  db->pVdbe = p;
  p->magic = VDBE_MAGIC_INIT;
  return p;
}